

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.h
# Opt level: O3

void vera::flipPixelsVertically<unsigned_short>
               (unsigned_short *_pixels,int _width,int _height,int _bytes_per_pixel)

{
  size_t __size;
  void *__dest;
  long lVar1;
  long lVar2;
  unsigned_short *__src;
  
  lVar2 = (long)(_width * _bytes_per_pixel);
  __size = lVar2 * 2;
  __dest = malloc(__size);
  lVar1 = (_height + -1) * lVar2;
  if (0 < lVar1) {
    __src = _pixels;
    do {
      memcpy(__dest,__src,__size);
      memcpy(__src,_pixels + lVar1,__size);
      memcpy(_pixels + lVar1,__dest,__size);
      __src = __src + lVar2;
      _pixels = _pixels + -lVar2;
    } while (__src < (unsigned_short *)(((long)_height * 2 + -2) * lVar2 + (long)_pixels));
  }
  free(__dest);
  return;
}

Assistant:

void flipPixelsVertically(T *_pixels, int _width, int _height, int _bytes_per_pixel) {
    const size_t stride = _width * _bytes_per_pixel;
    T *row = (T*)malloc(stride * sizeof(T));
    T *low = _pixels;
    T *high = &_pixels[(_height - 1) * stride];
    for (; low < high; low += stride, high -= stride) {
        std::memcpy(row, low, stride * sizeof(T));
        std::memcpy(low, high, stride * sizeof(T));
        std::memcpy(high, row, stride * sizeof(T));
    }
    free(row);
}